

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.h
# Opt level: O0

void __thiscall
HighsCliqueTable::BronKerboschData::BronKerboschData
          (BronKerboschData *this,vector<double,_std::allocator<double>_> *sol)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x55c228);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x55c235);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x55c242);
  std::
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  ::vector((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
            *)0x55c24f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c25c);
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0x3ff0cccccccccccd;
  in_RDI[0x12] = 0x3eb0c6f7a0b5ed8d;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 10000;
  *(undefined4 *)(in_RDI + 0x14) = 100;
  lVar1 = std::numeric_limits<long>::max();
  in_RDI[0x15] = lVar1;
  in_RDI[0x16] = 0;
  return;
}

Assistant:

BronKerboschData(const std::vector<double>& sol) : sol(sol) {}